

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall mario::TcpClient::~TcpClient(TcpClient *this)

{
  EventLoop *pEVar1;
  bool bVar2;
  element_type *this_00;
  _func_void_shared_ptr<mario::Connector>_ptr *local_110;
  type local_108;
  TimerCallback local_f0;
  code *local_d0;
  undefined8 local_c8;
  type local_c0;
  Functor local_80;
  EventLoop *local_60;
  _Bind<void_(*(mario::EventLoop_*,_std::_Placeholder<1>))(mario::EventLoop_*,_const_std::shared_ptr<mario::TcpConnection>_&)>
  local_58;
  undefined1 local_48 [8];
  CloseCallback cb;
  MutexLockGuard lock;
  TcpConnectionPtr conn;
  TcpClient *this_local;
  
  std::shared_ptr<mario::TcpConnection>::shared_ptr((shared_ptr<mario::TcpConnection> *)&lock);
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)&cb._M_invoker,&this->_mutex);
  std::shared_ptr<mario::TcpConnection>::operator=
            ((shared_ptr<mario::TcpConnection> *)&lock,&this->_connection);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)&cb._M_invoker);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock);
  if (bVar2) {
    local_60 = (EventLoop *)detail::removeConnection;
    std::
    bind<void(*)(mario::EventLoop*,std::shared_ptr<mario::TcpConnection>const&),mario::EventLoop*&,std::_Placeholder<1>const&>
              (&local_58._M_f,&local_60,(_Placeholder<1> *)this);
    std::function<void(std::shared_ptr<mario::TcpConnection>const&)>::
    function<std::_Bind<void(*(mario::EventLoop*,std::_Placeholder<1>))(mario::EventLoop*,std::shared_ptr<mario::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<mario::TcpConnection>const&)> *)local_48,&local_58);
    pEVar1 = this->_loop;
    local_d0 = TcpConnection::setCloseCallback;
    local_c8 = 0;
    std::
    bind<void(mario::TcpConnection::*)(std::function<void(std::shared_ptr<mario::TcpConnection>const&)>const&),std::shared_ptr<mario::TcpConnection>&,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>&>
              (&local_c0,(offset_in_TcpConnection_to_subr *)&local_d0,
               (shared_ptr<mario::TcpConnection> *)&lock,
               (function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)local_48);
    std::function<void()>::
    function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>))(std::function<void(std::shared_ptr<mario::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&local_80,&local_c0);
    EventLoop::runInLoop(pEVar1,&local_80);
    std::function<void_()>::~function(&local_80);
    std::
    _Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_&)>
    ::~_Bind(&local_c0);
    std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>::~function
              ((function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)local_48);
  }
  else {
    this_00 = std::__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_connector);
    Connector::stop(this_00);
    pEVar1 = this->_loop;
    local_110 = detail::removeConnector;
    std::bind<void(*)(std::shared_ptr<mario::Connector>const&),std::shared_ptr<mario::Connector>&>
              (&local_108,&local_110,&this->_connector);
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<mario::Connector>))(std::shared_ptr<mario::Connector>const&)>,void>
              ((function<void()> *)&local_f0,&local_108);
    EventLoop::runAfter(pEVar1,1.0,&local_f0);
    std::function<void_()>::~function(&local_f0);
    std::
    _Bind<void_(*(std::shared_ptr<mario::Connector>))(const_std::shared_ptr<mario::Connector>_&)>::
    ~_Bind(&local_108);
  }
  std::shared_ptr<mario::TcpConnection>::~shared_ptr((shared_ptr<mario::TcpConnection> *)&lock);
  std::shared_ptr<mario::TcpConnection>::~shared_ptr(&this->_connection);
  MutexLock::~MutexLock(&this->_mutex);
  std::
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  ::~function(&this->_messageCallback);
  std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>::~function
            (&this->_connectionCallback);
  std::shared_ptr<mario::Connector>::~shared_ptr(&this->_connector);
  return;
}

Assistant:

TcpClient::~TcpClient() {
    TcpConnectionPtr conn;
    {
        MutexLockGuard lock(_mutex);
        conn = _connection;
    }

    if (conn) {
        CloseCallback cb = std::bind(&detail::removeConnection, _loop, _1);
        _loop->runInLoop(
                std::bind(&TcpConnection::setCloseCallback, conn, cb)
                );
    } else {
        _connector->stop();
        _loop->runAfter(1, std::bind(&detail::removeConnector, _connector));
    }
}